

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsIis.cpp
# Opt level: O3

bool __thiscall HighsIis::trivial(HighsIis *this,HighsLp *lp,HighsOptions *options)

{
  double *pdVar1;
  pointer piVar2;
  pointer piVar3;
  byte bVar4;
  int iVar5;
  int iVar6;
  HighsInt status;
  bool bVar8;
  long lVar9;
  long lVar10;
  bool bVar11;
  double dVar12;
  vector<int,_std::allocator<int>_> count;
  value_type_conflict2 local_4c;
  vector<int,_std::allocator<int>_> local_48;
  int iVar7;
  
  invalidate(this);
  iVar5 = (options->super_HighsOptionsStruct).iis_strategy;
  bVar8 = false;
  bVar4 = 1;
  do {
    if (bVar8 == (iVar5 != 1)) {
      if (0 < (long)lp->num_col_) {
        dVar12 = (options->super_HighsOptionsStruct).primal_feasibility_tolerance;
        lVar9 = 0;
        do {
          if (dVar12 + dVar12 <
              (lp->col_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[lVar9] -
              (lp->col_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[lVar9]) {
            addCol(this,(HighsInt)lVar9,4);
            break;
          }
          lVar9 = lVar9 + 1;
        } while (lp->num_col_ != lVar9);
      }
      bVar11 = (this->col_index_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish ==
               (this->col_index_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
    }
    else {
      if (0 < (long)lp->num_row_) {
        dVar12 = (options->super_HighsOptionsStruct).primal_feasibility_tolerance;
        lVar9 = 0;
        do {
          if (dVar12 + dVar12 <
              (lp->row_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[lVar9] -
              (lp->row_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[lVar9]) {
            addRow(this,(HighsInt)lVar9,4);
            break;
          }
          lVar9 = lVar9 + 1;
        } while (lp->num_row_ != lVar9);
      }
      bVar11 = (this->row_index_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish ==
               (this->row_index_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
    }
    bVar8 = true;
    bVar11 = (bool)(bVar11 & bVar4);
    bVar4 = 0;
  } while (bVar11);
  iVar5 = (int)((ulong)((long)(this->col_index_).super__Vector_base<int,_std::allocator<int>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                       (long)(this->col_index_).super__Vector_base<int,_std::allocator<int>_>.
                             _M_impl.super__Vector_impl_data._M_start) >> 2);
  iVar7 = (int)((ulong)((long)(this->row_index_).super__Vector_base<int,_std::allocator<int>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                       (long)(this->row_index_).super__Vector_base<int,_std::allocator<int>_>.
                             _M_impl.super__Vector_impl_data._M_start) >> 2);
  iVar6 = iVar7 + iVar5;
  if (iVar6 == 0 || SCARRY4(iVar7,iVar5) != iVar6 < 0) {
    local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
         = (pointer)0x0;
    local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
         = (pointer)0x0;
    local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    local_4c = 0;
    std::vector<int,_std::allocator<int>_>::_M_fill_assign(&local_48,(long)lp->num_row_,&local_4c);
    iVar5 = lp->num_col_;
    if (0 < iVar5) {
      piVar2 = (lp->a_matrix_).start_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      piVar3 = (lp->a_matrix_).index_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      iVar6 = *piVar2;
      lVar9 = 0;
      do {
        lVar10 = lVar9 + 1;
        lVar9 = lVar9 + 1;
        iVar7 = piVar2[lVar10];
        if (iVar6 < piVar2[lVar10]) {
          lVar10 = (long)iVar6;
          do {
            local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start[piVar3[lVar10]] =
                 local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[piVar3[lVar10]] + 1;
            lVar10 = lVar10 + 1;
          } while (lVar10 < piVar2[lVar9]);
          iVar5 = lp->num_col_;
          iVar7 = piVar2[lVar9];
        }
        iVar6 = iVar7;
      } while (lVar9 < iVar5);
    }
    iVar5 = lp->num_row_;
    if (0 < iVar5) {
      lVar9 = 0;
      do {
        if (local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start[lVar9] < 1) {
          dVar12 = (options->super_HighsOptionsStruct).primal_feasibility_tolerance;
          status = 2;
          if ((dVar12 < (lp->row_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl
                        .super__Vector_impl_data._M_start[lVar9]) ||
             (dVar12 = -dVar12, status = 3,
             pdVar1 = (lp->row_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start + lVar9,
             *pdVar1 <= dVar12 && dVar12 != *pdVar1)) {
            addRow(this,(HighsInt)lVar9,status);
          }
          if ((this->row_index_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish !=
              (this->row_index_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start) {
            this->valid_ = true;
            this->strategy_ = (options->super_HighsOptionsStruct).iis_strategy;
            bVar8 = true;
            goto LAB_00226545;
          }
          iVar5 = lp->num_row_;
        }
        lVar9 = lVar9 + 1;
      } while (lVar9 < iVar5);
    }
    bVar8 = false;
LAB_00226545:
    if (local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
  }
  else {
    this->valid_ = true;
    this->strategy_ = (options->super_HighsOptionsStruct).iis_strategy;
    bVar8 = true;
  }
  return bVar8;
}

Assistant:

bool HighsIis::trivial(const HighsLp& lp, const HighsOptions& options) {
  this->invalidate();
  const bool col_priority =
      //      options.iis_strategy == kIisStrategyFromRayColPriority ||
      options.iis_strategy == kIisStrategyFromLpColPriority;
  for (HighsInt k = 0; k < 2; k++) {
    if ((col_priority && k == 0) || (!col_priority && k == 1)) {
      // Loop over columns first
      for (HighsInt iCol = 0; iCol < lp.num_col_; iCol++) {
        if (lp.col_lower_[iCol] - lp.col_upper_[iCol] >
            2 * options.primal_feasibility_tolerance) {
          this->addCol(iCol, kIisBoundStatusBoxed);
          break;
        }
      }
      if (this->col_index_.size() > 0) break;
    } else {
      // Loop over rows first
      for (HighsInt iRow = 0; iRow < lp.num_row_; iRow++) {
        if (lp.row_lower_[iRow] - lp.row_upper_[iRow] >
            2 * options.primal_feasibility_tolerance) {
          this->addRow(iRow, kIisBoundStatusBoxed);
          break;
        }
      }
      if (this->row_index_.size() > 0) break;
    }
  }
  HighsInt num_iis_col = this->col_index_.size();
  HighsInt num_iis_row = this->row_index_.size();
  // If one is found then we're done
  if (num_iis_col + num_iis_row > 0) {
    // Should have found exactly 1
    assert((num_iis_col == 1 || num_iis_row == 1) &&
           num_iis_col + num_iis_row < 2);
    this->valid_ = true;
    this->strategy_ = options.iis_strategy;
    return true;
  }
  // Now look for empty rows that cannot have zero activity
  std::vector<HighsInt> count;
  count.assign(lp.num_row_, 0);
  for (HighsInt iCol = 0; iCol < lp.num_col_; iCol++) {
    for (HighsInt iEl = lp.a_matrix_.start_[iCol];
         iEl < lp.a_matrix_.start_[iCol + 1]; iEl++)
      count[lp.a_matrix_.index_[iEl]]++;
  }
  assert(this->row_index_.size() == 0);
  for (HighsInt iRow = 0; iRow < lp.num_row_; iRow++) {
    if (count[iRow] > 0) continue;
    if (lp.row_lower_[iRow] > options.primal_feasibility_tolerance) {
      this->addRow(iRow, kIisBoundStatusLower);
    } else if (lp.row_upper_[iRow] < -options.primal_feasibility_tolerance) {
      this->addRow(iRow, kIisBoundStatusUpper);
    }
    if (this->row_index_.size() > 0) {
      this->valid_ = true;
      this->strategy_ = options.iis_strategy;
      return true;
    }
  }
  return false;
}